

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O3

int definemacro(int f,int n)

{
  line *plVar1;
  int iVar2;
  line *__ptr;
  
  macrocount = 0;
  if (macrodef == 0) {
    if (maclhead != (line *)0x0) {
      plVar1 = maclhead->l_fp;
      __ptr = plVar1;
      if (plVar1 != maclhead) {
        do {
          plVar1 = __ptr->l_fp;
          free(__ptr);
          __ptr = plVar1;
        } while (plVar1 != maclhead);
      }
      free(plVar1);
    }
    iVar2 = 0;
    plVar1 = lalloc(0);
    maclhead = plVar1;
    if (plVar1 != (line *)0x0) {
      ewprintf("Defining Keyboard Macro...");
      plVar1->l_bp = plVar1;
      plVar1->l_fp = plVar1;
      iVar2 = 1;
      macrodef = iVar2;
      maclcur = plVar1;
    }
  }
  else {
    iVar2 = 0;
    ewprintf("already defining macro");
    macrodef = iVar2;
  }
  return iVar2;
}

Assistant:

int
definemacro(int f, int n)
{
	struct line	*lp1, *lp2;

	macrocount = 0;

	if (macrodef) {
		ewprintf("already defining macro");
		return (macrodef = FALSE);
	}

	/* free lines allocated for string arguments */
	if (maclhead != NULL) {
		for (lp1 = maclhead->l_fp; lp1 != maclhead; lp1 = lp2) {
			lp2 = lp1->l_fp;
			free(lp1);
		}
		free(lp1);
	}

	if ((maclhead = lp1 = lalloc(0)) == NULL)
		return (FALSE);

	ewprintf("Defining Keyboard Macro...");
	maclcur = lp1->l_fp = lp1->l_bp = lp1;
	return (macrodef = TRUE);
}